

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void ldamath::vexpdigammify_2(vw *all,float *gamma,float *norm,float underflow_threshold)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float *pfVar5;
  long lVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 in_XMM1 [16];
  v4sf afVar8;
  v4sf p;
  
  pauVar1 = (undefined1 (*) [16])(gamma + all->lda);
  for (pfVar5 = gamma; (gamma < pauVar1 && (((ulong)pfVar5 & 0xf) != 0)); pfVar5 = pfVar5 + 1) {
    fVar7 = fastdigamma(*(float *)*(undefined1 (*) [16])gamma);
    fVar7 = fastexp(fVar7 - *(float *)*(undefined1 (*) [16])norm);
    in_XMM1._4_4_ = extraout_XMM0_Db;
    in_XMM1._0_4_ = fVar7;
    in_XMM1._8_4_ = extraout_XMM0_Dc;
    in_XMM1._12_4_ = extraout_XMM0_Dd;
    fVar7 = fmaxf(underflow_threshold,fVar7);
    *(float *)*(undefined1 (*) [16])gamma = fVar7;
    gamma = (float *)((long)*(undefined1 (*) [16])gamma + 4);
    norm = (float *)(*(undefined1 (*) [16])norm + 4);
  }
  while ((((ulong)pfVar5 & 0xf) == 0 && ((undefined1 (*) [16])((long)gamma + 0x10) < pauVar1))) {
    afVar8._8_8_ = in_XMM1._0_8_;
    afVar8._0_8_ = *(undefined8 *)*(undefined1 (*) [16])gamma;
    afVar8 = vfastdigamma((ldamath *)all,afVar8);
    auVar3 = *(undefined1 (*) [16])norm;
    p._8_8_ = auVar3._0_8_;
    p[0] = afVar8[0] - auVar3._0_4_;
    p[1] = afVar8[1] - auVar3._4_4_;
    afVar8 = vfastexp((ldamath *)all,p);
    auVar4._4_4_ = underflow_threshold;
    auVar4._0_4_ = underflow_threshold;
    auVar4._8_4_ = underflow_threshold;
    auVar4._12_4_ = underflow_threshold;
    auVar3._8_4_ = extraout_XMM0_Dc_00;
    auVar3._0_8_ = afVar8._0_8_;
    auVar3._12_4_ = extraout_XMM0_Dd_00;
    in_XMM1 = maxps(auVar4,auVar3);
    *(undefined1 (*) [16])gamma = in_XMM1;
    norm = (float *)((long)norm + 0x10);
    gamma = (float *)((long)gamma + 0x10);
  }
  for (lVar6 = 0; pauVar2 = (undefined1 (*) [16])((long)*(undefined1 (*) [16])gamma + lVar6),
      pauVar2 < pauVar1; lVar6 = lVar6 + 4) {
    fVar7 = fastdigamma(*(float *)*pauVar2);
    fVar7 = fastexp(fVar7 - *(float *)(*(undefined1 (*) [16])norm + lVar6));
    fVar7 = fmaxf(underflow_threshold,fVar7);
    *(float *)*pauVar2 = fVar7;
  }
  return;
}

Assistant:

void vexpdigammify_2(vw &all, float *gamma, const float *norm, const float underflow_threshold)
{
  float *fp = gamma;
  const float *np;
  const float *fpend = gamma + all.lda;

  for (np = norm; fp < fpend && !is_aligned16(fp); ++fp, ++np)
    *fp = fmax(underflow_threshold, fastexp(fastdigamma(*fp) - *np));

  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4, np += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    arg = vfastdigamma(arg);
    v4sf vnorm = _mm_loadu_ps(np);
    arg = arg - vnorm;
    arg = vfastexp(arg);
    arg = _mm_max_ps(v4sfl(underflow_threshold), arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp, ++np) *fp = fmax(underflow_threshold, fastexp(fastdigamma(*fp) - *np));
}